

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O3

sds duckdb_hll::sdsmapchars(sds s,char *from,char *to,size_t setlen)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  switch(s[-1] & 7) {
  case 0:
    uVar1 = (ulong)((byte)s[-1] >> 3);
    break;
  case 1:
    uVar1 = (ulong)(byte)s[-4];
    break;
  case 2:
    uVar1 = (ulong)*(ushort *)(s + -6);
    break;
  case 3:
    uVar1 = (ulong)*(uint *)(s + -10);
    break;
  case 4:
    uVar1 = *(ulong *)(s + -0x12);
    break;
  default:
    goto switchD_01856656_default;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (setlen != 0) {
        sVar3 = 0;
        do {
          if (s[uVar2] == from[sVar3]) {
            s[uVar2] = to[sVar3];
            break;
          }
          sVar3 = sVar3 + 1;
        } while (setlen != sVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
switchD_01856656_default:
  return s;
}

Assistant:

sds sdsmapchars(sds s, const char *from, const char *to, size_t setlen) {
    size_t j, i, l = sdslen(s);

    for (j = 0; j < l; j++) {
        for (i = 0; i < setlen; i++) {
            if (s[j] == from[i]) {
                s[j] = to[i];
                break;
            }
        }
    }
    return s;
}